

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# about_impl.cpp
# Opt level: O0

Element __thiscall ui::AboutImpl::Render(AboutImpl *this)

{
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_00;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  shared_ptr<ftxui::Node> *local_1d8;
  shared_ptr<ftxui::Node> *local_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  allocator<std::shared_ptr<ftxui::Node>_> local_153;
  undefined1 local_152;
  allocator<std::shared_ptr<ftxui::Node>_> local_151;
  AboutImpl *local_150;
  undefined1 local_148 [24];
  pointer local_130;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_128;
  allocator<std::shared_ptr<ftxui::Node>_> local_10a [2];
  Decorator local_108;
  undefined1 local_e8 [40];
  undefined1 local_c0 [32];
  undefined1 local_a0 [24];
  undefined1 local_88 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_30;
  AboutImpl *this_local;
  
  local_152 = 1;
  local_68._M_pi = &local_60;
  local_10a[1] = (allocator<std::shared_ptr<ftxui::Node>_>)0x1;
  local_e8._32_8_ = local_c0;
  this_local = this;
  ftxui::filler();
  local_e8._32_8_ = local_c0 + 0x10;
  ftxui::filler();
  local_e8._32_8_ = (ComponentBase *)local_a0;
  RenderBackground((AboutImpl *)local_e8);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_108,
             ftxui::hcenter);
  ftxui::operator|((ftxui *)local_a0,(Element *)local_e8,&local_108);
  local_10a[1] = (allocator<std::shared_ptr<ftxui::Node>_>)0x0;
  local_a0._16_8_ = local_c0;
  local_88._0_8_ = 3;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(local_10a);
  __l_00._M_len = local_88._0_8_;
  __l_00._M_array = (iterator)local_a0._16_8_;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_88 + 8),__l_00,local_10a);
  ftxui::vbox((ftxui *)&local_60,(Elements *)(local_88 + 8));
  local_150 = (AboutImpl *)local_148;
  local_68._M_pi = &local_50;
  RenderForeground(local_150);
  local_148._16_8_ = local_148;
  local_130 = (pointer)0x1;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_151);
  __l._M_len = (size_type)local_130;
  __l._M_array = (iterator)local_148._16_8_;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_128,__l,&local_151);
  ftxui::vbox((ftxui *)&local_50,&local_128);
  local_152 = 0;
  local_40._vptr__Sp_counted_base = (_func_int **)&local_60;
  local_40._M_use_count = 2;
  local_40._M_weak_count = 0;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_153);
  __l_01._M_len._0_4_ = local_40._M_use_count;
  __l_01._M_len._4_4_ = local_40._M_weak_count;
  __l_01._M_array = (iterator)local_40._vptr__Sp_counted_base;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_30,__l_01,&local_153);
  ftxui::dbox((ftxui *)this,&local_30);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_30);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_153);
  local_1a8 = &local_40;
  do {
    local_1a8 = local_1a8 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr((shared_ptr<ftxui::Node> *)local_1a8);
  } while (local_1a8 != &local_60);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_128);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_151);
  local_1c0 = (shared_ptr<ftxui::Node> *)(local_148 + 0x10);
  do {
    local_1c0 = local_1c0 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_1c0);
  } while (local_1c0 != (shared_ptr<ftxui::Node> *)local_148);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            ((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *
             )(local_88 + 8));
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(local_10a);
  local_1d8 = (shared_ptr<ftxui::Node> *)(local_a0 + 0x10);
  do {
    local_1d8 = local_1d8 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_1d8);
  } while (local_1d8 != (shared_ptr<ftxui::Node> *)local_c0);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_108);
  std::shared_ptr<ftxui::Node>::~shared_ptr((shared_ptr<ftxui::Node> *)local_e8);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    return dbox({
        vbox({
            filler(),
            filler(),
            RenderBackground() | hcenter,
        }),
        vbox({
            RenderForeground(),
        }),
    });
  }